

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int head_main(DHANDLE dhandle)

{
  params_enumerate(dhandle,enum_params,(void *)0x0);
  response_send(dhandle,"Hello From HEAD!\n",0x11);
  response_send(dhandle,"Hello From HEAD!\n",0x11);
  response_header_set(dhandle,"Content-Type","music");
  response_header_set(dhandle,"Content-Type","text/html");
  response_header_set(dhandle,"Dino-Type","Wine");
  return 200;
}

Assistant:

HEAD(main) {
    PARAMS_ENUMERATE(enum_params, NULL);

    char *data = "Hello From HEAD!\n";

    RESPONSE_SEND(data, strlen(data));

    RESPONSE_SEND(data, strlen(data));

    RSP_HEADER_SET("Content-Type", "music");

    RSP_HEADER_SET("Content-Type", "text/html");

    RSP_HEADER_SET("Dino-Type", "Wine");

    return HTTP_ERROR_CODE_OK;
}